

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSubmitHandler.cxx
# Opt level: O0

void __thiscall cmCTestSubmitHandler::Initialize(cmCTestSubmitHandler *this)

{
  uint local_14;
  Part p;
  cmCTestSubmitHandler *this_local;
  
  for (local_14 = 0; local_14 != 0xc; local_14 = local_14 + 1) {
    this->SubmitPart[local_14] = true;
  }
  this->HasWarnings = false;
  this->HasErrors = false;
  cmCTestGenericHandler::Initialize(&this->super_cmCTestGenericHandler);
  std::__cxx11::string::clear();
  this->HTTPProxyType = 0;
  std::__cxx11::string::clear();
  this->LogFile = (ostream *)0x0;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->Files);
  return;
}

Assistant:

void cmCTestSubmitHandler::Initialize()
{
  // We submit all available parts by default.
  for (cmCTest::Part p = cmCTest::PartStart; p != cmCTest::PartCount;
       p = cmCTest::Part(p + 1)) {
    this->SubmitPart[p] = true;
  }
  this->HasWarnings = false;
  this->HasErrors = false;
  this->Superclass::Initialize();
  this->HTTPProxy.clear();
  this->HTTPProxyType = 0;
  this->HTTPProxyAuth.clear();
  this->LogFile = nullptr;
  this->Files.clear();
}